

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::cgi_forwarder::on_post_data_read
          (cgi_forwarder *this,error_code *e,size_t len)

{
  bool bVar1;
  element_type *peVar2;
  error_code *in_RSI;
  cgi_forwarder *in_RDI;
  enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder> *in_stack_ffffffffffffff28;
  stream_socket *this_00;
  size_t in_stack_ffffffffffffff50;
  mutable_buffer *in_stack_ffffffffffffff58;
  const_buffer *in_stack_ffffffffffffff60;
  callback local_48 [72];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    cleanup(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383f8c);
    (*peVar2->_vptr_connection[0x12])();
    this_00 = &in_RDI->scgi_;
    std::vector<char,_std::allocator<char>_>::front((vector<char,_std::allocator<char>_> *)this_00);
    booster::aio::buffer(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    booster::aio::const_buffer::const_buffer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder>::shared_from_this
              (in_stack_ffffffffffffff28);
    mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
              ((offset_in_cgi_forwarder_to_subr)in_stack_ffffffffffffff60,
               (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)in_stack_ffffffffffffff58
              );
    booster::callback<void(std::error_code_const&,unsigned_long)>::
    callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)this_00,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *)
               in_stack_ffffffffffffff28);
    booster::aio::stream_socket::async_write((const_buffer *)this_00,local_48);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x384058);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)this_00);
    std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x38406c);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x384079);
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x384083);
  }
  return;
}

Assistant:

void on_post_data_read(booster::system::error_code const &e,size_t len)
		{
			if(e)  { cleanup(); return; }
			conn_->on_async_read_complete();
			scgi_.async_write(
				booster::aio::buffer(&post_.front(),len),
				mfunc_to_io_handler(&cgi_forwarder::on_post_data_written,shared_from_this()));
		}